

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O1

void __thiscall VRle::Data::translate(Data *this,VPoint *p)

{
  undefined2 uVar1;
  undefined2 uVar2;
  pointer pSVar3;
  Span *i;
  VPoint VVar4;
  pointer pSVar5;
  int iVar6;
  int iVar8;
  undefined1 auVar7 [16];
  
  VVar4.mx = p->mx - (this->mOffset).mx;
  VVar4.my = p->my - (this->mOffset).my;
  this->mOffset = VVar4;
  pSVar5 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar3 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar5 != pSVar3) {
    auVar7._8_8_ = 0;
    auVar7._0_4_ = (this->mOffset).mx;
    auVar7._4_4_ = (this->mOffset).my;
    auVar7 = pshuflw(auVar7,auVar7,0xe8);
    do {
      uVar1 = pSVar5->x;
      uVar2 = pSVar5->y;
      pSVar5->x = uVar1 + auVar7._0_2_;
      pSVar5->y = uVar2 + auVar7._2_2_;
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar3);
  }
  updateBbox(this);
  iVar6 = (this->mOffset).mx;
  iVar8 = (this->mOffset).my;
  (this->mBbox).x1 = (this->mBbox).x1 + iVar6;
  (this->mBbox).y1 = (this->mBbox).y1 + iVar8;
  (this->mBbox).x2 = (this->mBbox).x2 + iVar6;
  (this->mBbox).y2 = (this->mBbox).y2 + iVar8;
  return;
}

Assistant:

void VRle::Data::translate(const VPoint &p)
{
    // take care of last offset if applied
    mOffset = p - mOffset;
    int x = mOffset.x();
    int y = mOffset.y();
    for (auto &i : mSpans) {
        i.x = i.x + x;
        i.y = i.y + y;
    }
    updateBbox();
    mBbox.translate(mOffset.x(), mOffset.y());
}